

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v7::detail::code_point_length<char>(char *begin)

{
  int len;
  char lengths [32];
  char *begin_local;
  
  builtin_strncpy(lengths,"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x11);
  lengths[0x11] = '\0';
  lengths[0x12] = '\0';
  lengths[0x13] = '\0';
  lengths[0x14] = '\0';
  lengths[0x15] = '\0';
  lengths[0x16] = '\0';
  lengths[0x17] = '\0';
  lengths[0x18] = '\x02';
  lengths[0x19] = '\x02';
  lengths[0x1a] = '\x02';
  lengths[0x1b] = '\x02';
  lengths[0x1c] = '\x03';
  lengths[0x1d] = '\x03';
  lengths[0x1e] = '\x04';
  lengths[0x1f] = '\0';
  return (int)lengths[(int)(uint)(byte)*begin >> 3] +
         (uint)((lengths[(int)(uint)(byte)*begin >> 3] != 0 ^ 0xffU) & 1);
}

Assistant:

FMT_CONSTEXPR int code_point_length(const Char* begin) {
  if (const_check(sizeof(Char) != 1)) return 1;
  constexpr char lengths[] = {1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
                              0, 0, 0, 0, 0, 0, 0, 0, 2, 2, 2, 2, 3, 3, 4, 0};
  int len = lengths[static_cast<unsigned char>(*begin) >> 3];

  // Compute the pointer to the next character early so that the next
  // iteration can start working on the next character. Neither Clang
  // nor GCC figure out this reordering on their own.
  return len + !len;
}